

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator_common.h
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::
FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::FieldGeneratorMap
          (FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator> *this,
          Descriptor *descriptor)

{
  this->descriptor_ = descriptor;
  (this->field_generators_).
  super__Vector_base<const_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*,_std::allocator<const_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->field_generators_).
  super__Vector_base<const_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*,_std::allocator<const_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->field_generators_).
  super__Vector_base<const_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*,_std::allocator<const_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<const_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*,_std::allocator<const_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*>_>
  ::reserve(&this->field_generators_,(long)descriptor->field_count_);
  return;
}

Assistant:

explicit FieldGeneratorMap(const Descriptor* descriptor)
      : descriptor_(descriptor) {
    field_generators_.reserve(static_cast<size_t>(descriptor->field_count()));
  }